

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtclll(fitsfile *fptr,int colnum,int *typecode,LONGLONG *repeat,LONGLONG *width,int *status)

{
  int iVar1;
  long lVar2;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined8 *in_R8;
  int *in_R9;
  long tmpwidth;
  int decims;
  int hdutype;
  tcolumn *colptr;
  int *in_stack_00000088;
  int *in_stack_00000090;
  long *in_stack_00000098;
  int *in_stack_000000a0;
  char *in_stack_000000a8;
  int *in_stack_000000b0;
  fitsfile *in_stack_000000b8;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_4;
  
  if (*in_R9 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000b8,in_stack_000000b0), 0 < iVar1)) {
        return *in_R9;
      }
    }
    else {
      ffmahd((fitsfile *)width,status._4_4_,(int *)colptr,_decims);
    }
    if ((in_ESI < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_ESI)) {
      *in_R9 = 0x12e;
      local_4 = 0x12e;
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0;
      iVar1 = ffghdt((fitsfile *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (iVar1 < 1) {
        if (in_stack_ffffffffffffffbc == 1) {
          ffasfm(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                 in_stack_00000088);
          *in_R8 = in_stack_ffffffffffffffb0;
          if (in_RCX != (undefined8 *)0x0) {
            *in_RCX = 1;
          }
        }
        else {
          if (in_RDX != (undefined4 *)0x0) {
            *in_RDX = *(undefined4 *)(lVar2 + 0x50);
          }
          if (in_R8 != (undefined8 *)0x0) {
            *in_R8 = *(undefined8 *)(lVar2 + 0x98);
          }
          if (in_RCX != (undefined8 *)0x0) {
            *in_RCX = *(undefined8 *)(lVar2 + 0x58);
          }
        }
        local_4 = *in_R9;
      }
      else {
        local_4 = *in_R9;
      }
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgtclll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,       /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            LONGLONG *repeat, /* O - repeat count of field                   */
            LONGLONG *width, /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get Type of table column. 
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    tcolumn *colptr;
    int hdutype, decims;
    long tmpwidth;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum - 1);    /* offset to correct column */

    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == ASCII_TBL)
    {
       ffasfm(colptr->tform, typecode, &tmpwidth, &decims, status);
       *width = tmpwidth;
       
      if (repeat)
           *repeat = 1;
    }
    else
    {
      if (typecode)
          *typecode = colptr->tdatatype;

      if (width)
          *width = colptr->twidth;

      if (repeat)
          *repeat = colptr->trepeat;
    }

    return(*status);
}